

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::JobManager::MakeBorderRouterChoice
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,BorderRouter *br)

{
  string *this_00;
  ushort uVar1;
  pointer pcVar2;
  undefined1 uVar3;
  uint16_t uVar4;
  NetworkId NVar5;
  State SVar6;
  Status SVar7;
  int iVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  BorderRouter *item_1;
  pointer pBVar11;
  iterator __end3;
  char *pcVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  BorderRouter *item;
  pointer pBVar13;
  BorderRouter *item_3;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  BRArray choice;
  BRArray brs;
  Network nwk;
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  local_168;
  BorderRouterArray local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  string local_128;
  undefined1 local_100 [8];
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_d8 [8];
  char *pcStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  format_string_checker<char> *local_b8;
  code *local_b0;
  Network local_a8;
  pointer local_48;
  char *pcStack_40;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  local_130 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_130;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_148.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_148.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_168.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  persistent_storage::Network::Network(&local_a8);
  SVar7 = persistent_storage::Registry::GetBorderRoutersInNetwork
                    ((this->mInterpreter->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,aNid,&local_148);
  pBVar13 = local_148.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (SVar7 == kSuccess) {
    if ((long)local_148.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x188) {
      *(undefined8 *)&br->mId =
           *(undefined8 *)
            &(local_148.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start)->mId;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
      (br->mAgent).mPort = (pBVar13->mAgent).mPort;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(br->mAgent).mDiscriminator,&(pBVar13->mAgent).mDiscriminator);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
      *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar13->mAgent).mState;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
      (br->mAgent).mExtendedPanId = (pBVar13->mAgent).mExtendedPanId;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
      (br->mAgent).mPartitionId = (pBVar13->mAgent).mPartitionId;
      (br->mAgent).mActiveTimestamp = (pBVar13->mAgent).mActiveTimestamp;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&(br->mAgent).mVendorOui,&(pBVar13->mAgent).mVendorOui);
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
      uVar3 = (pBVar13->mAgent).field_0x141;
      uVar4 = (pBVar13->mAgent).mBbrPort;
      (br->mAgent).mBbrSeqNumber = (pBVar13->mAgent).mBbrSeqNumber;
      (br->mAgent).field_0x141 = uVar3;
      (br->mAgent).mBbrPort = uVar4;
      std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
      (br->mAgent).mPresentFlags = (pBVar13->mAgent).mPresentFlags;
      (br->mAgent).mUpdateTimestamp.mTime = (pBVar13->mAgent).mUpdateTimestamp.mTime;
      goto LAB_0028cb55;
    }
    SVar7 = persistent_storage::Registry::GetNetworkByXpan
                      ((this->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,aNid,&local_a8);
    pBVar13 = local_148.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (SVar7 != kSuccess) {
      local_d8._0_4_ = 0xd;
      pcStack_d0 = "network not found by XPAN \'{}\'";
      local_c8._M_allocated_capacity = 0x1e;
      local_c8._8_8_ = 0x100000000;
      local_b0 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar12 = "network not found by XPAN \'{}\'";
      local_b8 = (format_string_checker<char> *)local_d8;
      do {
        pcVar9 = pcVar12 + 1;
        if (*pcVar12 == '}') {
          if ((pcVar9 == "") || (*pcVar9 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar9 = pcVar12 + 2;
        }
        else if (*pcVar12 == '{') {
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar12,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_d8);
        }
        pcVar12 = pcVar9;
      } while (pcVar9 != "");
      utils::Hex<unsigned_long>((string *)local_d8,aNid);
      local_48 = (pointer)local_d8;
      pcStack_40 = pcStack_d0;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1e;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_48;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_128,(v10 *)"network not found by XPAN \'{}\'",fmt_00,args_00);
      local_100._0_4_ = kNotFound;
      local_f8 = local_f0._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_128._M_dataplus._M_p,
                 local_128._M_dataplus._M_p + local_128._M_string_length);
      __return_storage_ptr__->mCode = local_100._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
      if (local_f8 != local_f0._M_local_buf + 8) {
        operator_delete(local_f8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      paVar10 = &local_c8;
      goto LAB_0028ca11;
    }
    if (local_a8.mCcm < 1) {
      if (local_148.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_148.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar11 = local_148.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (((uint)(pBVar11->mAgent).mState & 7) != 0) {
            std::
            vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ::push_back(&local_168,pBVar11);
          }
          pBVar11 = pBVar11 + 1;
        } while (pBVar11 != pBVar13);
      }
LAB_0028cfa6:
      if (local_168.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_168.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar13 = local_168.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          SVar6 = (pBVar13->mAgent).mState;
          if (((uint)SVar6 & 0x60) != 0 && ((uint)SVar6 & 0x10) != 0) {
            NVar5.mId = (pBVar13->mNetworkId).mId;
            br->mId = (BorderRouterId)(pBVar13->mId).mId;
            br->mNetworkId = (NetworkId)NVar5.mId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
            (br->mAgent).mPort = (pBVar13->mAgent).mPort;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mDiscriminator,&(pBVar13->mAgent).mDiscriminator);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
            *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar13->mAgent).mState;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
            (br->mAgent).mExtendedPanId = (pBVar13->mAgent).mExtendedPanId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
            (br->mAgent).mPartitionId = (pBVar13->mAgent).mPartitionId;
            (br->mAgent).mActiveTimestamp = (pBVar13->mAgent).mActiveTimestamp;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mVendorOui,&(pBVar13->mAgent).mVendorOui);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
            uVar3 = (pBVar13->mAgent).field_0x141;
            uVar4 = (pBVar13->mAgent).mBbrPort;
            (br->mAgent).mBbrSeqNumber = (pBVar13->mAgent).mBbrSeqNumber;
            (br->mAgent).field_0x141 = uVar3;
            (br->mAgent).mBbrPort = uVar4;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
            (br->mAgent).mPresentFlags = (pBVar13->mAgent).mPresentFlags;
            (br->mAgent).mUpdateTimestamp.mTime = (pBVar13->mAgent).mUpdateTimestamp.mTime;
            iVar8 = 4;
            goto LAB_0028d179;
          }
          pBVar13 = pBVar13 + 1;
        } while (pBVar13 !=
                 local_168.
                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar8 = 0x11;
LAB_0028d179:
      pBVar13 = local_168.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8 == 4) goto LAB_0028cb55;
      if (iVar8 == 0x11) {
        if (local_168.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_168.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pBVar11 = local_168.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            SVar6 = (pBVar11->mAgent).mState;
            iVar8 = 0;
            if (((uint)SVar6 & 0x10) != 0) {
              NVar5.mId = (pBVar11->mNetworkId).mId;
              br->mId = (BorderRouterId)(pBVar11->mId).mId;
              br->mNetworkId = (NetworkId)NVar5.mId;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
              (br->mAgent).mPort = (pBVar11->mAgent).mPort;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&(br->mAgent).mDiscriminator,&(pBVar11->mAgent).mDiscriminator);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
              *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar11->mAgent).mState;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
              (br->mAgent).mExtendedPanId = (pBVar11->mAgent).mExtendedPanId;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
              (br->mAgent).mPartitionId = (pBVar11->mAgent).mPartitionId;
              (br->mAgent).mActiveTimestamp = (pBVar11->mAgent).mActiveTimestamp;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&(br->mAgent).mVendorOui,&(pBVar11->mAgent).mVendorOui);
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
              uVar3 = (pBVar11->mAgent).field_0x141;
              uVar4 = (pBVar11->mAgent).mBbrPort;
              (br->mAgent).mBbrSeqNumber = (pBVar11->mAgent).mBbrSeqNumber;
              (br->mAgent).field_0x141 = uVar3;
              (br->mAgent).mBbrPort = uVar4;
              std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
              (br->mAgent).mPresentFlags = (pBVar11->mAgent).mPresentFlags;
              (br->mAgent).mUpdateTimestamp.mTime = (pBVar11->mAgent).mUpdateTimestamp.mTime;
              iVar8 = 4;
            }
            if (((uint)SVar6 & 0x10) != 0) goto LAB_0028d356;
            pBVar11 = pBVar11 + 1;
          } while (pBVar11 != pBVar13);
        }
        iVar8 = 0x15;
LAB_0028d356:
        pBVar13 = local_168.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8 == 4) goto LAB_0028cb55;
        if (iVar8 == 0x15) {
          if (local_168.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_168.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pBVar11 = local_168.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              SVar6 = (pBVar11->mAgent).mState;
              if (((uint)SVar6 & 0x18) == 0) {
                iVar8 = 0;
              }
              else {
                NVar5.mId = (pBVar11->mNetworkId).mId;
                br->mId = (BorderRouterId)(pBVar11->mId).mId;
                br->mNetworkId = (NetworkId)NVar5.mId;
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
                (br->mAgent).mPort = (pBVar11->mAgent).mPort;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (&(br->mAgent).mDiscriminator,&(pBVar11->mAgent).mDiscriminator);
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
                *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar11->mAgent).mState;
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
                (br->mAgent).mExtendedPanId = (pBVar11->mAgent).mExtendedPanId;
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
                (br->mAgent).mPartitionId = (pBVar11->mAgent).mPartitionId;
                (br->mAgent).mActiveTimestamp = (pBVar11->mAgent).mActiveTimestamp;
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                          (&(br->mAgent).mVendorOui,&(pBVar11->mAgent).mVendorOui);
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
                uVar3 = (pBVar11->mAgent).field_0x141;
                uVar4 = (pBVar11->mAgent).mBbrPort;
                (br->mAgent).mBbrSeqNumber = (pBVar11->mAgent).mBbrSeqNumber;
                (br->mAgent).field_0x141 = uVar3;
                (br->mAgent).mBbrPort = uVar4;
                std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
                (br->mAgent).mPresentFlags = (pBVar11->mAgent).mPresentFlags;
                (br->mAgent).mUpdateTimestamp.mTime = (pBVar11->mAgent).mUpdateTimestamp.mTime;
                iVar8 = 4;
              }
              if (((uint)SVar6 & 0x18) != 0) goto LAB_0028d534;
              pBVar11 = pBVar11 + 1;
            } while (pBVar11 != pBVar13);
          }
          iVar8 = 0x19;
LAB_0028d534:
          if (iVar8 == 4) goto LAB_0028cb55;
          if (iVar8 == 0x19) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)&local_128;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_100,(v10 *)"no active BR found",(string_view)ZEXT816(0x12),
                       args_01);
            local_d8._0_4_ = 5;
            pcStack_d0 = local_c8._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&pcStack_d0,CONCAT44(local_100._4_4_,local_100._0_4_),
                       local_f8 + CONCAT44(local_100._4_4_,local_100._0_4_));
            __return_storage_ptr__->mCode = local_d8._0_4_;
            std::__cxx11::string::operator=((string *)this_00,(string *)&pcStack_d0);
            if (pcStack_d0 != local_c8._M_local_buf + 8) {
              operator_delete(pcStack_d0);
            }
            paVar10 = &local_f0;
            goto LAB_0028ca11;
          }
        }
      }
    }
    else {
      if (local_148.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_148.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar13 = local_148.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar1 = *(ushort *)&(pBVar13->mAgent).mState;
          if (((uVar1 & 0x18) != 0 && (uVar1 & 7) != 0) && (~uVar1 & 0x180) == 0) {
            NVar5.mId = (pBVar13->mNetworkId).mId;
            br->mId = (BorderRouterId)(pBVar13->mId).mId;
            br->mNetworkId = (NetworkId)NVar5.mId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mAddr);
            (br->mAgent).mPort = (pBVar13->mAgent).mPort;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mDiscriminator,&(pBVar13->mAgent).mDiscriminator);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mThreadVersion);
            *(undefined2 *)&(br->mAgent).mState = *(undefined2 *)&(pBVar13->mAgent).mState;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mNetworkName);
            (br->mAgent).mExtendedPanId = (pBVar13->mAgent).mExtendedPanId;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorName);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mModelName);
            (br->mAgent).mPartitionId = (pBVar13->mAgent).mPartitionId;
            (br->mAgent).mActiveTimestamp = (pBVar13->mAgent).mActiveTimestamp;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mVendorData);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                      (&(br->mAgent).mVendorOui,&(pBVar13->mAgent).mVendorOui);
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mDomainName);
            uVar3 = (pBVar13->mAgent).field_0x141;
            uVar4 = (pBVar13->mAgent).mBbrPort;
            (br->mAgent).mBbrSeqNumber = (pBVar13->mAgent).mBbrSeqNumber;
            (br->mAgent).field_0x141 = uVar3;
            (br->mAgent).mBbrPort = uVar4;
            std::__cxx11::string::_M_assign((string *)&(br->mAgent).mServiceName);
            (br->mAgent).mPresentFlags = (pBVar13->mAgent).mPresentFlags;
            (br->mAgent).mUpdateTimestamp.mTime = (pBVar13->mAgent).mUpdateTimestamp.mTime;
            iVar8 = 4;
            goto LAB_0028cf26;
          }
          pBVar13 = pBVar13 + 1;
        } while (pBVar13 !=
                 local_148.
                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      iVar8 = 9;
LAB_0028cf26:
      pBVar13 = local_148.
                super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar8 == 4) goto LAB_0028cb55;
      if (iVar8 == 9) {
        if (local_148.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_148.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pBVar11 = local_148.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar1 = *(ushort *)&(pBVar11->mAgent).mState;
            if ((uVar1 & 7) != 0 && (char)uVar1 < '\0') {
              std::
              vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ::push_back(&local_168,pBVar11);
            }
            pBVar11 = pBVar11 + 1;
          } while (pBVar11 != pBVar13);
        }
        goto LAB_0028cfa6;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mMlp._M_dataplus._M_p != &local_a8.mMlp.field_2) {
      operator_delete(local_a8.mMlp._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mName._M_dataplus._M_p != &local_a8.mName.field_2) {
      operator_delete(local_a8.mName._M_dataplus._M_p);
    }
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&local_168);
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&local_148);
    pcVar2 = (this_00->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != local_130) {
      operator_delete(pcVar2);
    }
  }
  else {
    local_d8._0_4_ = int_type;
    pcStack_d0 = "br lookup failed with status={}";
    local_c8._M_allocated_capacity = 0x1f;
    local_c8._8_8_ = 0x100000000;
    local_b0 = ::fmt::v10::detail::
               parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar12 = "br lookup failed with status={}";
    local_b8 = (format_string_checker<char> *)local_d8;
    do {
      pcVar9 = pcVar12 + 1;
      if (*pcVar12 == '}') {
        if ((pcVar9 == "") || (*pcVar9 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar9 = pcVar12 + 2;
      }
      else if (*pcVar12 == '{') {
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar12,"",(format_string_checker<char> *)local_d8);
      }
      pcVar12 = pcVar9;
    } while (pcVar9 != "");
    local_d8 = (undefined1  [8])(ulong)SVar7;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x1f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_d8;
    ::fmt::v10::vformat_abi_cxx11_(&local_128,(v10 *)"br lookup failed with status={}",fmt,args);
    local_100._0_4_ = kRegistryError;
    local_f8 = local_f0._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    __return_storage_ptr__->mCode = local_100._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_f8);
    if (local_f8 != local_f0._M_local_buf + 8) {
      operator_delete(local_f8);
    }
    paVar10 = &local_128.field_2;
LAB_0028ca11:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar10->_M_allocated_capacity)[-2] != paVar10) {
      operator_delete((undefined1 *)(&paVar10->_M_allocated_capacity)[-2]);
    }
LAB_0028cb55:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mMlp._M_dataplus._M_p != &local_a8.mMlp.field_2) {
      operator_delete(local_a8.mMlp._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.mName._M_dataplus._M_p != &local_a8.mName.field_2) {
      operator_delete(local_a8.mName._M_dataplus._M_p);
    }
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&local_168);
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector(&local_148);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::MakeBorderRouterChoice(uint64_t aNid, BorderRouter &br)
{
    Error          error;
    BRArray        brs;
    BRArray        choice;
    Network        nwk;
    RegistryStatus status = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));
    if (brs.size() == 1)
    {
        // looks like not much of a choice
        br = brs.front();
        ExitNow();
    }
    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    if (nwk.mCcm > 0) // Dealing with domain network
    {
        // - try to find active and connectable Primary BBR
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsPrimary &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                if (item.mAgent.mState.mBbrIsActive &&
                    item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
                {
                    /// @todo: ideally here we would make sure the
                    ///        Border Router's connection mode @ref
                    ///        BorderAgent::State::ConnectionMode::kX509Connection
                    ///        is specified, otherwise the announced
                    ///        BBR appears inconsistent with Thread
                    ///        spec. Although nothing we could do at
                    ///        runtime here, a warning message might
                    ///        be useful as an indication of a
                    ///        potential issue
                    br = item;
                    ExitNow();
                }
            }
        }
        // - go on with other active and connectable BBRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mBbrIsActive &&
                item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }
    else // Dealing with standalone networks
    {
        // go on with connectable BRs
        for (const auto &item : brs)
        {
            if (item.mAgent.mState.mConnectionMode > BorderAgent::State::ConnectionMode::kNotAllowed)
            {
                choice.push_back(item);
            }
        }
    }

    // Below a final triage is done

    // - prefer br with high-availability
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive &&
            item.mAgent.mState.mAvailability > BorderAgent::State::Availability::kInfrequent)
        {
            br = item;
            ExitNow();
        }
    }
    // - prefer br with Thread Interface actively participating in communication
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotActive)
        {
            br = item;
            ExitNow();
        }
    }
    // - try to find br with Thread Interface at least enabled
    for (const auto &item : choice)
    {
        if (item.mAgent.mState.mThreadIfStatus > BorderAgent::State::ThreadInterfaceStatus::kNotInitialized)
        {
            br = item;
            ExitNow();
        }
    }
    error = ERROR_NOT_FOUND("no active BR found");
exit:
    return error;
}